

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::unaryByComponent<double>::call
          (unaryByComponent<double> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  
  uVar2 = Utils::getNumberOfComponentsForVariableType
                    (*(_variable_type *)&(this->super_unaryBase).super_functionObject.field_0x24);
  pcVar1 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = (*pcVar1)(*(undefined8 *)((long)argument_src + uVar3 * 8));
    *(undefined8 *)((long)result_dst + uVar3 * 8) = uVar4;
  }
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		glw::GLuint	n_components = Utils::getNumberOfComponentsForVariableType(m_arg_type);
		ResT*		   p_result		= (ResT*)result_dst;
		glw::GLdouble* p_arg		= (glw::GLdouble*)argument_src;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			p_result[component] = p_function(p_arg[component]);
		}
	}